

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
eval_internal(Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this
             ,Dispatch_State *t_ss)

{
  Type_Info t_ti;
  Type_Info t_ti_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  pointer pbVar1;
  bool bVar2;
  __type _Var3;
  const_reference pvVar4;
  pointer pAVar5;
  size_type sVar6;
  type pAVar7;
  Dispatch_Engine *pDVar8;
  __uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
  in_RDX;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *t_node;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  reference_wrapper<chaiscript::Type_Conversions::Conversion_Saves> *a_1;
  Boxed_Value BVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a8;
  name_conflict_error *e;
  anon_class_48_3_baf6a18f_for_m_f local_2f8;
  undefined1 local_2c8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  type_info *local_298;
  type_info *ptStack_290;
  type_info *local_288;
  string local_278;
  __sv_type local_258;
  undefined1 auStack_248 [8];
  Type_Info type;
  anon_class_48_3_baf6a18f_for_m_f local_228;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  Type_Info local_1c8;
  string local_1a8;
  string *local_188;
  string *function_name;
  anon_class_48_3_e1829392_for_m_f local_178;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_148;
  reference_wrapper<chaiscript::detail::Dispatch_Engine> local_138;
  reference_wrapper<chaiscript::detail::Dispatch_Engine> engine;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> guard;
  size_t numparams;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e0;
  const_iterator local_d8;
  undefined1 local_d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  Param_Types param_types;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  t_param_names;
  string *class_name;
  AST_Node_Impl_Ptr<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> guardnode;
  Dispatch_State *t_ss_local;
  Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this_local;
  
  guardnode._M_t.
  super___uniq_ptr_impl<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_*,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
  .
  super__Head_base<0UL,_chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
        )(__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
          )in_RDX.
           super___uniq_ptr_impl<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_*,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
           .
           super__Head_base<0UL,_chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_*,_false>
           ._M_head_impl;
  std::
  unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>
  ::
  unique_ptr<std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>,void>
            ((unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>
              *)&class_name);
  pvVar4 = std::
           vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
           ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                         *)&t_ss[2].m_conversions,0);
  pAVar5 = std::
           unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
           ::operator->(pvVar4);
  t_param_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = &(pAVar5->super_AST_Node).text;
  param_types._27_1_ = 1;
  local_80 = &local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"this",&local_81);
  param_types._27_1_ = 0;
  local_58._0_8_ = &local_78;
  local_58._8_8_ = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&param_types.field_0x1a);
  __l._M_len = local_58._8_8_;
  __l._M_array = (iterator)local_58._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48,__l,(allocator_type *)&param_types.field_0x1a);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&param_types.field_0x1a);
  local_3a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  do {
    local_3a8 = local_3a8 + -1;
    std::__cxx11::string::~string((string *)local_3a8);
  } while (local_3a8 != &local_78);
  std::allocator<char>::~allocator(&local_81);
  dispatch::Param_Types::Param_Types
            ((Param_Types *)
             &args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar6 = std::
          vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
          ::size((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                  *)&t_ss[2].m_conversions);
  if (2 < sVar6) {
    pvVar4 = std::
             vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
             ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                           *)&t_ss[2].m_conversions,2);
    pAVar5 = std::
             unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
             ::operator->(pvVar4);
    if ((pAVar5->super_AST_Node).identifier == Arg_List) {
      pvVar4 = std::
               vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
               ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                             *)&t_ss[2].m_conversions,2);
      pAVar7 = std::
               unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
               ::operator*(pvVar4);
      Arg_List_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::
      get_arg_names_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d0,
                 (Arg_List_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
                  *)pAVar7,t_node);
      local_e0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_d8,&local_e0);
      local_e8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_d0);
      local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_d0);
      local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                 insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                           ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                            local_48,local_d8,local_e8,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )local_f0);
      pvVar4 = std::
               vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
               ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                             *)&t_ss[2].m_conversions,2);
      pAVar7 = std::
               unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
               ::operator*(pvVar4);
      Arg_List_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
      get_arg_types((Param_Types *)&numparams,pAVar7,
                    (Dispatch_State *)
                    guardnode._M_t.
                    super___uniq_ptr_impl<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_*,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                    .
                    super__Head_base<0UL,_chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_*,_false>
                    ._M_head_impl);
      dispatch::Param_Types::operator=
                ((Param_Types *)
                 &args.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(Param_Types *)&numparams);
      dispatch::Param_Types::~Param_Types((Param_Types *)&numparams);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d0);
    }
  }
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&engine);
  pDVar8 = chaiscript::detail::Dispatch_State::operator*
                     ((Dispatch_State *)
                      guardnode._M_t.
                      super___uniq_ptr_impl<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_*,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                      .
                      super__Head_base<0UL,_chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_*,_false>
                      ._M_head_impl);
  std::reference_wrapper<chaiscript::detail::Dispatch_Engine>::
  reference_wrapper<chaiscript::detail::Dispatch_Engine&,void,chaiscript::detail::Dispatch_Engine*>
            (&local_138,pDVar8);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&t_ss[3].m_conversions.m_saves);
  guard.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = SUB84(sVar6,0);
  if (bVar2) {
    local_178.engine._M_data = local_138._M_data;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_178.t_param_names,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_48);
    a_1 = &t_ss[3].m_conversions.m_saves;
    std::
    shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>
    ::shared_ptr(&local_178.guardnode,
                 (shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>
                  *)a_1);
    function_name._4_4_ =
         guard.
         super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._0_4_;
    dispatch::
    make_dynamic_proxy_function<chaiscript::eval::Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::Function_Params_const&)_1_,int,std::shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>const&>
              ((dispatch *)&local_148,&local_178,(int *)((long)&function_name + 4),
               (shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>
                *)a_1);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::operator=
              ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&engine,&local_148);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_148);
    const::{lambda(chaiscript::Function_Params_const&)#1}::~Function_Params
              ((_lambda_chaiscript__Function_Params_const___1_ *)&local_178);
  }
  pvVar4 = std::
           vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
           ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                         *)&t_ss[2].m_conversions,1);
  pAVar5 = std::
           unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
           ::operator->(pvVar4);
  local_188 = &(pAVar5->super_AST_Node).text;
  _Var3 = std::operator==(local_188,
                          t_param_names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (_Var3) {
    std::__cxx11::string::string
              ((string *)&local_1a8,
               t_param_names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_1c8.m_type_info = (type_info *)0x0;
    local_1c8.m_bare_type_info = (type_info *)0x0;
    local_1c8.m_flags = 0;
    local_1c8._20_4_ = 0;
    Type_Info::Type_Info(&local_1c8);
    t_ti.m_bare_type_info = local_1c8.m_bare_type_info;
    t_ti.m_type_info = local_1c8.m_type_info;
    t_ti.m_flags = local_1c8.m_flags;
    t_ti._20_4_ = local_1c8._20_4_;
    dispatch::Param_Types::push_front
              ((Param_Types *)
               &args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1a8,t_ti);
    std::__cxx11::string::~string((string *)&local_1a8);
    pDVar8 = chaiscript::detail::Dispatch_State::operator->
                       ((Dispatch_State *)
                        guardnode._M_t.
                        super___uniq_ptr_impl<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_*,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                        .
                        super__Head_base<0UL,_chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_*,_false>
                        ._M_head_impl);
    pbVar1 = t_param_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_228.engine._M_data = local_138._M_data;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_228.t_param_names,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_48);
    std::
    shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>
    ::shared_ptr(&local_228.node,
                 (shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>
                  *)&t_ss[3].m_stack_holder);
    type._20_4_ = guard.
                  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi._0_4_;
    dispatch::
    make_dynamic_proxy_function<chaiscript::eval::Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::Function_Params_const&)_2_,int,std::shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>const&,chaiscript::dispatch::Param_Types&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>&>
              ((dispatch *)&local_1f8,&local_228,(int *)&type.field_0x14,
               (shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>
                *)&t_ss[3].m_stack_holder,
               (Param_Types *)
               &args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&engine);
    std::
    make_shared<chaiscript::dispatch::detail::Dynamic_Object_Constructor,std::__cxx11::string_const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
              (&local_1e8,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)pbVar1);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::
    shared_ptr<chaiscript::dispatch::detail::Dynamic_Object_Constructor,void>
              ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&local_1e8.field_2,
               (shared_ptr<chaiscript::dispatch::detail::Dynamic_Object_Constructor> *)&local_1e8);
    chaiscript::detail::Dispatch_Engine::add(pDVar8,(Proxy_Function *)&local_1e8.field_2,local_188);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
              ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&local_1e8.field_2);
    std::shared_ptr<chaiscript::dispatch::detail::Dynamic_Object_Constructor>::~shared_ptr
              ((shared_ptr<chaiscript::dispatch::detail::Dynamic_Object_Constructor> *)&local_1e8);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1f8);
    const::{lambda(chaiscript::Function_Params_const&)#2}::~Function_Params
              ((_lambda_chaiscript__Function_Params_const___2_ *)&local_228);
  }
  else {
    pDVar8 = chaiscript::detail::Dispatch_State::operator->
                       ((Dispatch_State *)
                        guardnode._M_t.
                        super___uniq_ptr_impl<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_*,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                        .
                        super__Head_base<0UL,_chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_*,_false>
                        ._M_head_impl);
    local_258 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)
                           t_param_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    chaiscript::detail::Dispatch_Engine::get_type((Type_Info *)auStack_248,pDVar8,local_258,false);
    std::__cxx11::string::string
              ((string *)&local_278,
               t_param_names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_288 = type.m_bare_type_info;
    local_298 = (type_info *)auStack_248;
    ptStack_290 = type.m_type_info;
    t_ti_00.m_bare_type_info = type.m_type_info;
    t_ti_00.m_type_info = (type_info *)auStack_248;
    t_ti_00._16_8_ = type.m_bare_type_info;
    dispatch::Param_Types::push_front
              ((Param_Types *)
               &args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_278,t_ti_00);
    std::__cxx11::string::~string((string *)&local_278);
    pDVar8 = chaiscript::detail::Dispatch_State::operator->
                       ((Dispatch_State *)
                        guardnode._M_t.
                        super___uniq_ptr_impl<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_*,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                        .
                        super__Head_base<0UL,_chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_*,_false>
                        ._M_head_impl);
    pbVar1 = t_param_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_2f8.engine._M_data = local_138._M_data;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2f8.t_param_names,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_48);
    std::
    shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>
    ::shared_ptr(&local_2f8.node,
                 (shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>
                  *)&t_ss[3].m_stack_holder);
    e._4_4_ = guard.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi._0_4_;
    dispatch::
    make_dynamic_proxy_function<chaiscript::eval::Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::Function_Params_const&)_3_,int,std::shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>const&,chaiscript::dispatch::Param_Types&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>&>
              ((dispatch *)local_2c8,&local_2f8,(int *)((long)&e + 4),
               (shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>
                *)&t_ss[3].m_stack_holder,
               (Param_Types *)
               &args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&engine);
    std::
    make_shared<chaiscript::dispatch::detail::Dynamic_Object_Function,std::__cxx11::string_const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,chaiscript::Type_Info&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_2c8 + 0x10),(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)pbVar1,
               (Type_Info *)local_2c8);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::
    shared_ptr<chaiscript::dispatch::detail::Dynamic_Object_Function,void>
              ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&local_2b8.field_2,
               (shared_ptr<chaiscript::dispatch::detail::Dynamic_Object_Function> *)
               (local_2c8 + 0x10));
    chaiscript::detail::Dispatch_Engine::add(pDVar8,(Proxy_Function *)&local_2b8.field_2,local_188);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
              ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&local_2b8.field_2);
    std::shared_ptr<chaiscript::dispatch::detail::Dynamic_Object_Function>::~shared_ptr
              ((shared_ptr<chaiscript::dispatch::detail::Dynamic_Object_Function> *)
               (local_2c8 + 0x10));
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
              ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)local_2c8);
    const::{lambda(chaiscript::Function_Params_const&)#3}::~Function_Params
              ((_lambda_chaiscript__Function_Params_const___3_ *)&local_2f8);
  }
  void_var();
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&engine);
  dispatch::Param_Types::~Param_Types
            ((Param_Types *)
             &args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  std::
  unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
  ::~unique_ptr((unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                 *)&class_name);
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        AST_Node_Impl_Ptr<T> guardnode;

        const std::string &class_name = this->children[0]->text;

        // The first param of a method is always the implied this ptr.
        std::vector<std::string> t_param_names{"this"};
        dispatch::Param_Types param_types;

        if ((this->children.size() > 2) && (this->children[2]->identifier == AST_Node_Type::Arg_List)) {
          auto args = Arg_List_AST_Node<T>::get_arg_names(*this->children[2]);
          t_param_names.insert(t_param_names.end(), args.begin(), args.end());
          param_types = Arg_List_AST_Node<T>::get_arg_types(*this->children[2], t_ss);
        }

        const size_t numparams = t_param_names.size();

        std::shared_ptr<dispatch::Proxy_Function_Base> guard;
        std::reference_wrapper<chaiscript::detail::Dispatch_Engine> engine(*t_ss);
        if (m_guard_node) {
          guard = dispatch::make_dynamic_proxy_function(
              [engine, t_param_names, guardnode = m_guard_node](const Function_Params &t_params) {
                return chaiscript::eval::detail::eval_function(engine, *guardnode, t_param_names, t_params);
              },
              static_cast<int>(numparams),
              m_guard_node);
        }

        try {
          const std::string &function_name = this->children[1]->text;

          if (function_name == class_name) {
            param_types.push_front(class_name, Type_Info());

            t_ss->add(std::make_shared<dispatch::detail::Dynamic_Object_Constructor>(
                          class_name,
                          dispatch::make_dynamic_proxy_function(
                              [engine, t_param_names, node = m_body_node](const Function_Params &t_params) {
                                return chaiscript::eval::detail::eval_function(engine, *node, t_param_names, t_params);
                              },
                              static_cast<int>(numparams),
                              m_body_node,
                              param_types,
                              guard)),
                      function_name);

          } else {
            // if the type is unknown, then this generates a function that looks up the type
            // at runtime. Defining the type first before this is called is better
            auto type = t_ss->get_type(class_name, false);
            param_types.push_front(class_name, type);

            t_ss->add(std::make_shared<dispatch::detail::Dynamic_Object_Function>(
                          class_name,
                          dispatch::make_dynamic_proxy_function(
                              [engine, t_param_names, node = m_body_node](const Function_Params &t_params) {
                                return chaiscript::eval::detail::eval_function(engine, *node, t_param_names, t_params);
                              },
                              static_cast<int>(numparams),
                              m_body_node,
                              param_types,
                              guard),
                          type),
                      function_name);
          }
        } catch (const exception::name_conflict_error &e) {
          throw exception::eval_error("Method redefined '" + e.name() + "'");
        }
        return void_var();
      }